

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O2

void __thiscall
dxil_spv::SPIRVModule::Impl::emit_entry_point
          (Impl *this,ExecutionModel model,char *name,bool physical_storage)

{
  Builder *this_00;
  Function *function;
  Instruction *pIVar1;
  undefined7 in_register_00000009;
  
  this->execution_model = model;
  this_00 = &this->builder;
  spv::Builder::addCapability(this_00,CapabilityShader);
  if ((int)CONCAT71(in_register_00000009,physical_storage) == 0) {
    (this->builder).addressModel = AddressingModelLogical;
    (this->builder).memoryModel = MemoryModelGLSL450;
  }
  else {
    (this->builder).addressModel = AddressingModelPhysicalStorageBuffer64;
    (this->builder).memoryModel = MemoryModelGLSL450;
    spv::Builder::addCapability(this_00,CapabilityPhysicalStorageBufferAddresses);
    spv::Builder::addExtension(this_00,"SPV_KHR_physical_storage_buffer");
  }
  function = spv::Builder::makeEntryPoint(this_00,"main");
  this->entry_function = function;
  pIVar1 = spv::Builder::addEntryPoint(this_00,model,function,name);
  this->entry_point = pIVar1;
  if (model == ExecutionModelFragment) {
    spv::Builder::addExecutionMode
              (this_00,this->entry_function,ExecutionModeOriginUpperLeft,-1,-1,-1);
  }
  if ((this->instruction_instrumentation).info.enabled == true) {
    spv::Builder::addExtension(this_00,"SPV_KHR_float_controls");
    spv::Builder::addCapability(this_00,CapabilitySignedZeroInfNanPreserve);
    if ((this->instruction_instrumentation).info.fp16 == true) {
      spv::Builder::addCapability(this_00,CapabilityFloat16);
      spv::Builder::addExecutionMode
                (this_00,this->entry_function,ExecutionModeSignedZeroInfNanPreserve,0x10,-1,-1);
    }
    if ((this->instruction_instrumentation).info.fp32 == true) {
      spv::Builder::addExecutionMode
                (this_00,this->entry_function,ExecutionModeSignedZeroInfNanPreserve,0x20,-1,-1);
    }
    if ((this->instruction_instrumentation).info.fp64 == true) {
      spv::Builder::addExecutionMode
                (this_00,this->entry_function,ExecutionModeSignedZeroInfNanPreserve,0x40,-1,-1);
      return;
    }
  }
  return;
}

Assistant:

void SPIRVModule::Impl::emit_entry_point(spv::ExecutionModel model, const char *name, bool physical_storage)
{
	execution_model = model;
	builder.addCapability(spv::Capability::CapabilityShader);

	if (physical_storage)
	{
		builder.setMemoryModel(spv::AddressingModel::AddressingModelPhysicalStorageBuffer64, spv::MemoryModelGLSL450);
		builder.addCapability(spv::CapabilityPhysicalStorageBufferAddresses);
		builder.addExtension("SPV_KHR_physical_storage_buffer");
	}
	else
		builder.setMemoryModel(spv::AddressingModel::AddressingModelLogical, spv::MemoryModel::MemoryModelGLSL450);

	entry_function = builder.makeEntryPoint("main");
	entry_point = builder.addEntryPoint(model, entry_function, name);
	if (model == spv::ExecutionModel::ExecutionModelFragment)
		builder.addExecutionMode(entry_function, spv::ExecutionModeOriginUpperLeft);

	if (instruction_instrumentation.info.enabled)
	{
		builder.addExtension("SPV_KHR_float_controls");
		builder.addCapability(spv::CapabilitySignedZeroInfNanPreserve);

		if (instruction_instrumentation.info.fp16)
		{
			builder.addCapability(spv::CapabilityFloat16);
			builder.addExecutionMode(entry_function, spv::ExecutionModeSignedZeroInfNanPreserve, 16);
		}

		if (instruction_instrumentation.info.fp32)
			builder.addExecutionMode(entry_function, spv::ExecutionModeSignedZeroInfNanPreserve, 32);

		if (instruction_instrumentation.info.fp64)
			builder.addExecutionMode(entry_function, spv::ExecutionModeSignedZeroInfNanPreserve, 64);
	}
}